

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::erase
          (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *this,
          TypedID<(spirv_cross::Types)0> *start_erase,TypedID<(spirv_cross::Types)0> *end_erase)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t __n;
  size_t sVar2;
  
  pTVar1 = (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).ptr;
  sVar2 = (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).buffer_size;
  __n = (long)pTVar1 + (sVar2 * 4 - (long)end_erase);
  if (__n == 0) {
    sVar2 = (long)start_erase - (long)pTVar1 >> 2;
  }
  else {
    memmove(start_erase,end_erase,__n);
    sVar2 = sVar2 - ((long)end_erase - (long)start_erase >> 2);
  }
  resize(this,sVar2);
  return;
}

Assistant:

void erase(T *start_erase, T *end_erase) SPIRV_CROSS_NOEXCEPT
	{
		if (end_erase == this->end())
		{
			resize(size_t(start_erase - this->begin()));
		}
		else
		{
			auto new_size = this->buffer_size - (end_erase - start_erase);
			std::move(end_erase, this->end(), start_erase);
			resize(new_size);
		}
	}